

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O3

void __thiscall LexicalAnalyzer::Parse(LexicalAnalyzer *this)

{
  uint uVar1;
  byte bVar2;
  pointer pcVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  pointer pbVar7;
  ulong uVar8;
  string word;
  string local_50;
  
  pbVar7 = (this->lines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->lines).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
    uVar8 = 0;
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::push_back((char)pbVar7 + (char)uVar8 * ' ');
      pbVar7 = (this->lines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar7[uVar8]._M_string_length != 0) {
        uVar5 = 0;
        iVar6 = 0;
        do {
          pcVar3 = pbVar7[uVar8]._M_dataplus._M_p;
          bVar2 = pcVar3[uVar5];
          if (((int)(char)bVar2 - 0x30U < 10) || (iVar4 = isalpha((int)(char)bVar2), iVar4 != 0))
          goto LAB_001061a1;
          uVar1 = bVar2 - 0x21;
          uVar5 = (ulong)uVar1;
          iVar4 = (int)uVar8;
          if (uVar1 < 0x3f) {
            if ((0x38000001UL >> (uVar5 & 0x3f) & 1) == 0) {
              if ((0x1400UL >> (uVar5 & 0x3f) & 1) == 0) {
                if ((0x4000000000002000U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_001061fd;
              }
              else if ((byte)(pcVar3[(long)iVar6 + -1] | 0x20U) != 0x65) {
                AddWord(this,&local_50,iVar4);
                std::__cxx11::string::push_back((char)&local_50);
                goto LAB_001062da;
              }
LAB_001061a1:
              std::__cxx11::string::push_back((char)&local_50);
            }
            else if ((bVar2 == 0x21 || ((bVar2 & 0xfe) == 0x3c || bVar2 == 0x3e)) &&
                    (pcVar3[(long)iVar6 + 1] == '=')) {
              AddWord(this,&local_50,iVar4);
              std::__cxx11::string::push_back((char)&local_50);
              std::__cxx11::string::push_back((char)&local_50);
              AddWord(this,&local_50,iVar4);
              iVar6 = iVar6 + 1;
            }
            else {
              AddWord(this,&local_50,iVar4);
              std::__cxx11::string::push_back((char)&local_50);
              AddWord(this,&local_50,iVar4);
            }
          }
          else {
LAB_001061fd:
            AddWord(this,&local_50,iVar4);
            if ((bVar2 != 9) && (bVar2 != 0x20)) {
              std::__cxx11::string::push_back((char)&local_50);
LAB_001062da:
              AddWord(this,&local_50,iVar4);
            }
          }
          iVar6 = iVar6 + 1;
          uVar5 = (ulong)iVar6;
          pbVar7 = (this->lines).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar5 < pbVar7[uVar8]._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
        pbVar7 = (this->lines).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)(this->lines).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5));
  }
  return;
}

Assistant:

void LexicalAnalyzer::Parse() {
    for (int i = 0; i < lines.size(); i++) {
        std::string word;
        lines[i] += ' ';//temporary space
        for (int j = 0; j < lines[i].size(); j++) {
            char ch = lines[i][j];
            if (isdigit(ch) || isalpha(ch) || ch == '_' || ch == '.') {//digit,alpha,underline
                word += ch;
            } else if (ch == '-' || ch == '+') {
                //operator - or minus ?
                if (lines[i][j - 1] == 'e' || lines[i][j - 1] == 'E') {
                    word += ch;
                } else {
                    AddWord(word, i);
                    word += ch;
                    AddWord(word, i);
                }
            } else if (ch == '=' || ch == '<' || ch == '>' || ch == '!') {
                char peek = lines[i][j + 1];
                if ((ch == '=' && peek == '=') || (ch == '<' && peek == '=') || (ch == '>' && peek == '=') ||
                    (ch == '!' && peek == '=')) {
                    AddWord(word, i);
                    word += ch;
                    word += peek;
                    AddWord(word, i);
                    ++j;
                } else {
                    AddWord(word, i);
                    word += ch;
                    AddWord(word, i);
                }
            } else {//others
                AddWord(word, i);
                if (ch == ' ' || ch == '\t') continue;
                word += ch;
                AddWord(word, i);
            }
        }
    }
}